

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O0

int ebur128_init_filter(ebur128_state *st)

{
  unsigned_long uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  filter_state *padVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double a0;
  double ra [3];
  double rb [3];
  double pa [3];
  double pb [3];
  double Vb;
  double Vh;
  double K;
  double Q;
  double G;
  double f0;
  int local_18;
  int j;
  int i;
  int errcode;
  ebur128_state *st_local;
  
  j = 0;
  uVar1 = st->samplerate;
  auVar10._8_4_ = (int)(uVar1 >> 0x20);
  auVar10._0_8_ = uVar1;
  auVar10._12_4_ = 0x45300000;
  dVar2 = tan(5284.078578647628 /
              ((auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)));
  dVar3 = pow(10.0,0.19999219269866736);
  dVar4 = pow(dVar3,0.4996667741545416);
  dVar5 = dVar2 * dVar2 + dVar2 / 0.7071752369554196 + 1.0;
  dVar6 = (dVar2 * dVar2 + dVar3 + (dVar4 * dVar2) / 0.7071752369554196) / dVar5;
  dVar7 = dVar2 * dVar2 - dVar3;
  dVar7 = (dVar7 + dVar7) / dVar5;
  dVar3 = (dVar2 * dVar2 + (dVar3 - (dVar4 * dVar2) / 0.7071752369554196)) / dVar5;
  dVar4 = dVar2 * dVar2 + -1.0;
  dVar4 = (dVar4 + dVar4) / dVar5;
  dVar5 = (dVar2 * dVar2 + (1.0 - dVar2 / 0.7071752369554196)) / dVar5;
  uVar1 = st->samplerate;
  auVar11._8_4_ = (int)(uVar1 >> 0x20);
  auVar11._0_8_ = uVar1;
  auVar11._12_4_ = 0x45300000;
  dVar2 = tan(119.8061151453059 /
              ((auVar11._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)));
  dVar8 = ((dVar2 * dVar2 + -1.0) * 2.0) / (dVar2 * dVar2 + dVar2 / 0.5003270373238773 + 1.0);
  dVar2 = (dVar2 * dVar2 + (1.0 - dVar2 / 0.5003270373238773)) /
          (dVar2 * dVar2 + dVar2 / 0.5003270373238773 + 1.0);
  st->d->b[0] = dVar6 * 1.0;
  st->d->b[1] = dVar6 * -2.0 + dVar7 * 1.0;
  st->d->b[2] = dVar3 * 1.0 + dVar6 * 1.0 + dVar7 * -2.0;
  st->d->b[3] = dVar7 * 1.0 + dVar3 * -2.0;
  st->d->b[4] = dVar3 * 1.0;
  st->d->a[0] = 1.0;
  st->d->a[1] = dVar8 * 1.0 + dVar4 * 1.0;
  st->d->a[2] = dVar5 * 1.0 + dVar2 * 1.0 + dVar4 * dVar8;
  st->d->a[3] = dVar4 * dVar2 + dVar5 * dVar8;
  st->d->a[4] = dVar5 * dVar2;
  padVar9 = (filter_state *)malloc((ulong)st->channels * 0x28);
  st->d->v = padVar9;
  if (st->d->v == (filter_state *)0x0) {
    j = 1;
  }
  else {
    for (local_18 = 0; local_18 < (int)st->channels; local_18 = local_18 + 1) {
      for (f0._4_4_ = 0; f0._4_4_ < 5; f0._4_4_ = f0._4_4_ + 1) {
        st->d->v[local_18][f0._4_4_] = 0.0;
      }
    }
  }
  return j;
}

Assistant:

static int ebur128_init_filter(ebur128_state* st) {
  int errcode = EBUR128_SUCCESS;
  int i, j;

  double f0 = 1681.974450955533;
  double G = 3.999843853973347;
  double Q = 0.7071752369554196;

  double K = tan(M_PI * f0 / (double) st->samplerate);
  double Vh = pow(10.0, G / 20.0);
  double Vb = pow(Vh, 0.4996667741545416);

  double pb[3] = { 0.0, 0.0, 0.0 };
  double pa[3] = { 1.0, 0.0, 0.0 };
  double rb[3] = { 1.0, -2.0, 1.0 };
  double ra[3] = { 1.0, 0.0, 0.0 };

  double a0 = 1.0 + K / Q + K * K;
  pb[0] = (Vh + Vb * K / Q + K * K) / a0;
  pb[1] = 2.0 * (K * K - Vh) / a0;
  pb[2] = (Vh - Vb * K / Q + K * K) / a0;
  pa[1] = 2.0 * (K * K - 1.0) / a0;
  pa[2] = (1.0 - K / Q + K * K) / a0;

  /* fprintf(stderr, "%.14f %.14f %.14f %.14f %.14f\n",
                     b1[0], b1[1], b1[2], a1[1], a1[2]); */

  f0 = 38.13547087602444;
  Q = 0.5003270373238773;
  K = tan(M_PI * f0 / (double) st->samplerate);

  ra[1] = 2.0 * (K * K - 1.0) / (1.0 + K / Q + K * K);
  ra[2] = (1.0 - K / Q + K * K) / (1.0 + K / Q + K * K);

  /* fprintf(stderr, "%.14f %.14f\n", a2[1], a2[2]); */

  st->d->b[0] = pb[0] * rb[0];
  st->d->b[1] = pb[0] * rb[1] + pb[1] * rb[0];
  st->d->b[2] = pb[0] * rb[2] + pb[1] * rb[1] + pb[2] * rb[0];
  st->d->b[3] = pb[1] * rb[2] + pb[2] * rb[1];
  st->d->b[4] = pb[2] * rb[2];

  st->d->a[0] = pa[0] * ra[0];
  st->d->a[1] = pa[0] * ra[1] + pa[1] * ra[0];
  st->d->a[2] = pa[0] * ra[2] + pa[1] * ra[1] + pa[2] * ra[0];
  st->d->a[3] = pa[1] * ra[2] + pa[2] * ra[1];
  st->d->a[4] = pa[2] * ra[2];

  st->d->v = (filter_state*) malloc(st->channels * sizeof(filter_state));
  CHECK_ERROR(!st->d->v, EBUR128_ERROR_NOMEM, exit);
  for (i = 0; i < (int) st->channels; ++i) {
    for (j = 0; j < FILTER_STATE_SIZE; ++j) {
      st->d->v[i][j] = 0.0;
    }
  }

exit:
  return errcode;
}